

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O3

reference __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::find_or_insert(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
                 *this,value_type *__obj)

{
  pointer pp_Var1;
  char *pcVar2;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var3;
  int iVar4;
  undefined4 uVar5;
  ulong uVar6;
  _Hashtable_node<std::pair<const_char_*const,_int>_> *p_Var7;
  char cVar8;
  char *pcVar9;
  
  resize(this,this->_M_num_elements + 1);
  pp_Var1 = (this->_M_buckets).
            super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = __obj->first;
  cVar8 = *pcVar2;
  if (cVar8 == '\0') {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    pcVar9 = pcVar2;
    do {
      pcVar9 = pcVar9 + 1;
      uVar6 = (long)cVar8 + uVar6 * 5;
      cVar8 = *pcVar9;
    } while (cVar8 != '\0');
  }
  uVar6 = uVar6 % (ulong)((long)(this->_M_buckets).
                                super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3);
  p_Var3 = pp_Var1[uVar6];
  for (p_Var7 = p_Var3; p_Var7 != (_Hashtable_node<std::pair<const_char_*const,_int>_> *)0x0;
      p_Var7 = p_Var7->_M_next) {
    if ((p_Var7->_M_val).first == pcVar2) goto LAB_00117d85;
  }
  p_Var7 = (_Hashtable_node<std::pair<const_char_*const,_int>_> *)operator_new(0x18);
  iVar4 = __obj->second;
  uVar5 = *(undefined4 *)&__obj->field_0xc;
  (p_Var7->_M_val).first = __obj->first;
  (p_Var7->_M_val).second = iVar4;
  *(undefined4 *)&(p_Var7->_M_val).field_0xc = uVar5;
  p_Var7->_M_next = p_Var3;
  (this->_M_buckets).
  super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[uVar6] = p_Var7;
  this->_M_num_elements = this->_M_num_elements + 1;
LAB_00117d85:
  return &p_Var7->_M_val;
}

Assistant:

typename hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::reference
hashtable<_Val,_Key,_HF,_Ex,_Eq,_All>::find_or_insert(const value_type& __obj)
{
  resize(_M_num_elements + 1);

  size_type __n = _M_bkt_num(__obj);
  _Node* __first = _M_buckets[__n];

  for (_Node* __cur = __first; __cur; __cur = __cur->_M_next)
    if (_M_equals(_M_get_key(__cur->_M_val), _M_get_key(__obj)))
      return __cur->_M_val;

  _Node* __tmp = _M_new_node(__obj);
  __tmp->_M_next = __first;
  _M_buckets[__n] = __tmp;
  ++_M_num_elements;
  return __tmp->_M_val;
}